

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_push_constant_block(CompilerGLSL *this,SPIRVariable *var)

{
  size_type sVar1;
  uint32_t local_1c;
  SPIRVariable *local_18;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  local_18 = var;
  var_local = (SPIRVariable *)this;
  local_1c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  sVar1 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&this->flattened_buffer_blocks,&local_1c);
  if (sVar1 == 0) {
    if (((this->options).vulkan_semantics & 1U) == 0) {
      if (((this->options).emit_push_constant_as_uniform_buffer & 1U) == 0) {
        emit_push_constant_block_glsl(this,local_18);
      }
      else {
        emit_buffer_block_native(this,local_18);
      }
    }
    else {
      emit_push_constant_block_vulkan(this,local_18);
    }
  }
  else {
    emit_buffer_block_flattened(this,local_18);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (flattened_buffer_blocks.count(var.self))
		emit_buffer_block_flattened(var);
	else if (options.vulkan_semantics)
		emit_push_constant_block_vulkan(var);
	else if (options.emit_push_constant_as_uniform_buffer)
		emit_buffer_block_native(var);
	else
		emit_push_constant_block_glsl(var);
}